

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_1adff5::Db::parseQualifiedType(Db *this)

{
  Cache CVar1;
  char *pcVar2;
  char *pcVar3;
  Cache CVar4;
  Cache CVar5;
  Qualifiers QVar6;
  long *plVar7;
  Node *pNVar8;
  Node *pNVar9;
  long *plVar10;
  StringView SVar11;
  
  pcVar2 = this->First;
  if ((pcVar2 == this->Last) || (*pcVar2 != 'U')) {
    QVar6 = parseCVQualifiers(this);
    pNVar8 = parseType(this);
    if (pNVar8 != (Node *)0x0) {
      if (QVar6 == QualNone) {
        return pNVar8;
      }
      pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      CVar4 = pNVar8->RHSComponentCache;
      CVar5 = pNVar8->ArrayCache;
      CVar1 = pNVar8->FunctionCache;
      pNVar9->K = KQualType;
      pNVar9->RHSComponentCache = CVar4;
      pNVar9->ArrayCache = CVar5;
      pNVar9->FunctionCache = CVar1;
      pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00187a60;
      *(Qualifiers *)&pNVar9->field_0xc = QVar6;
      pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
      return pNVar9;
    }
  }
  else {
    this->First = pcVar2 + 1;
    SVar11 = parseBareSourceName(this);
    plVar10 = (long *)SVar11.Last;
    plVar7 = (long *)SVar11.First;
    if (plVar7 != plVar10) {
      if (((ulong)((long)plVar10 - (long)plVar7) < 9) ||
         ((char)plVar7[1] != 'o' || *plVar7 != 0x746f7270636a626f)) {
        pNVar8 = parseQualifiedType(this);
        if (pNVar8 != (Node *)0x0) {
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KVendorExtQualType;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00187a08;
          pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
          *(StringView *)&pNVar9[1].K = SVar11;
          return pNVar9;
        }
      }
      else {
        pcVar2 = this->First;
        pcVar3 = this->Last;
        this->First = (char *)((long)plVar7 + 9);
        this->Last = (char *)plVar10;
        SVar11 = parseBareSourceName(this);
        this->First = pcVar2;
        this->Last = pcVar3;
        if ((SVar11.First != SVar11.Last) &&
           (pNVar8 = parseQualifiedType(this), pNVar8 != (Node *)0x0)) {
          pNVar9 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar9->K = KObjCProtoName;
          pNVar9->RHSComponentCache = No;
          pNVar9->ArrayCache = No;
          pNVar9->FunctionCache = No;
          pNVar9->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001879b0;
          pNVar9[1]._vptr_Node = (_func_int **)pNVar8;
          *(StringView *)&pNVar9[1].K = SVar11;
          return pNVar9;
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseQualifiedType() {
  if (consumeIf('U')) {
    StringView Qual = parseBareSourceName();
    if (Qual.empty())
      return nullptr;

    // FIXME parse the optional <template-args> here!

    // extension            ::= U <objc-name> <objc-type>  # objc-type<identifier>
    if (Qual.startsWith("objcproto")) {
      StringView ProtoSourceName = Qual.dropFront(std::strlen("objcproto"));
      StringView Proto;
      {
        SwapAndRestore<const char *> SaveFirst(First, ProtoSourceName.begin()),
                                     SaveLast(Last, ProtoSourceName.end());
        Proto = parseBareSourceName();
      }
      if (Proto.empty())
        return nullptr;
      Node *Child = parseQualifiedType();
      if (Child == nullptr)
        return nullptr;
      return make<ObjCProtoName>(Child, Proto);
    }

    Node *Child = parseQualifiedType();
    if (Child == nullptr)
      return nullptr;
    return make<VendorExtQualType>(Child, Qual);
  }

  Qualifiers Quals = parseCVQualifiers();
  Node *Ty = parseType();
  if (Ty == nullptr)
    return nullptr;
  if (Quals != QualNone)
    Ty = make<QualType>(Ty, Quals);
  return Ty;
}